

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O1

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::expand_
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this)

{
  uint64_t key;
  pointer psVar1;
  ulong uVar2;
  long lVar3;
  this_type new_ht;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> local_58;
  
  standard_hash_table(&local_58,(this->capa_size_).bits_ + 1);
  psVar1 = (this->table_).
           super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->table_).
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      key = *(uint64_t *)((long)psVar1 + lVar3 + -8);
      if (key != 0xffffffffffffffff) {
        set(&local_58,key,*(uint64_t *)((long)&psVar1->key + lVar3));
      }
      uVar2 = uVar2 + 1;
      psVar1 = (this->table_).
               super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->table_).
                                   super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4));
  }
  std::
  vector<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
  ::_M_move_assign(&this->table_,&local_58);
  this->size_ = local_58.size_;
  this->max_size_ = local_58.max_size_;
  (this->capa_size_).bits_ = local_58.capa_size_.bits_;
  *(undefined4 *)&(this->capa_size_).field_0x4 = local_58.capa_size_._4_4_;
  (this->capa_size_).mask_ = local_58.capa_size_.mask_;
  if (local_58.table_.
      super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.table_.
                    super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.table_.
                          super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.table_.
                          super__Vector_base<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type,_std::allocator<poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::slot_type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void expand_() {
        this_type new_ht{capa_size_.bits() + 1};
#ifdef POPLAR_EXTRA_STATS
        new_ht.num_resize_ = num_resize_ + 1;
#endif

        for (uint64_t i = 0; i < table_.size(); ++i) {
            if (table_[i].key != UINT64_MAX) {
                new_ht.set(table_[i].key, table_[i].val);
            }
        }

        assert(size() == new_ht.size());
        *this = std::move(new_ht);
    }